

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

bool CB_ADF::update_statistics(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  float fVar1;
  pointer ppeVar2;
  pointer ppeVar3;
  long lVar4;
  size_t num_features;
  pointer ppeVar5;
  multi_ex *__range1;
  bool test_example;
  float loss;
  
  ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  num_features = 0;
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (ppeVar5 = ppeVar2; ppeVar5 != ppeVar3; ppeVar5 = ppeVar5 + 1) {
    num_features = num_features + (*ppeVar5)->num_features;
  }
  fVar1 = (c->gen_cs).known_cost.probability;
  loss = 0.0;
  test_example = 0.0 < fVar1;
  if (0.0 < fVar1) {
    loss = CB_ALGS::get_unbiased_cost
                     (&(c->gen_cs).known_cost,&(c->gen_cs).pred_scores,
                      ((ec->pred).a_s._begin)->action);
    ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  for (lVar4 = 0; (long)ppeVar3 - (long)ppeVar2 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    test_example = (bool)(test_example & ppeVar2[lVar4]->test_only);
  }
  shared_data::update(all->sd,test_example,0.0 < fVar1,loss,ec->weight,num_features);
  return 0.0 < fVar1;
}

Assistant:

bool update_statistics(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  size_t num_features = 0;

  uint32_t action = ec.pred.a_s[0].action;
  for (const auto & example : *ec_seq)
    num_features += example->num_features;

  float loss = 0.;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
    loss = get_unbiased_cost(&(c.gen_cs.known_cost), c.gen_cs.pred_scores, action);
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);
  return labeled_example;
}